

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# programStreamDemuxer.h
# Opt level: O1

int64_t __thiscall ProgramStreamDemuxer::getTrackDelay(ProgramStreamDemuxer *this,int32_t pid)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  int64_t iVar3;
  _Base_ptr p_Var4;
  long lVar5;
  _Base_ptr p_Var6;
  int32_t local_c;
  
  p_Var1 = &(this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = (this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < pid]) {
    if (pid <= (int)p_Var6[1]._M_color) {
      p_Var4 = p_Var6;
    }
  }
  p_Var6 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var6 = p_Var4, pid < (int)p_Var4[1]._M_color)) {
    p_Var6 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var6 == p_Var1) {
    iVar3 = 0;
  }
  else {
    local_c = pid;
    pmVar2 = std::map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>::
             operator[](&this->m_firstPtsTime,&local_c);
    lVar5 = this->m_firstVideoPTS;
    if (lVar5 == -1) {
      lVar5 = this->m_firstPTS;
    }
    iVar3 = llround((double)(*pmVar2 - lVar5) / 90.0);
  }
  return iVar3;
}

Assistant:

int64_t getTrackDelay(const int32_t pid) override
    {
        if (m_firstPtsTime.find(pid) != m_firstPtsTime.end())
            return llround(
                static_cast<double>(m_firstPtsTime[pid] - (m_firstVideoPTS != -1 ? m_firstVideoPTS : m_firstPTS)) /
                90.0);  // convert to ms

        return 0;
    }